

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O0

GLuint compile_shader(string *p_content,ShaderType p_type)

{
  ostream *poVar1;
  GLchar *local_28;
  char *shader_code_cstr;
  GLuint shader_id;
  ShaderType p_type_local;
  string *p_content_local;
  
  shader_code_cstr._0_4_ = 0;
  shader_code_cstr._4_4_ = p_type;
  _shader_id = p_content;
  if (p_type == VERTEX) {
    shader_code_cstr._0_4_ = (*glad_glCreateShader)(0x8b31);
  }
  else if (p_type == FRAGMENT) {
    shader_code_cstr._0_4_ = (*glad_glCreateShader)(0x8b30);
  }
  else {
    if (p_type != GEOMETRY) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"unable to compile shader");
      std::operator<<(poVar1,"\n");
      return (GLuint)shader_code_cstr;
    }
    shader_code_cstr._0_4_ = (*glad_glCreateShader)(0x8dd9);
  }
  local_28 = (GLchar *)std::__cxx11::string::c_str();
  (*glad_glShaderSource)((GLuint)shader_code_cstr,1,&local_28,(GLint *)0x0);
  (*glad_glCompileShader)((GLuint)shader_code_cstr);
  test_shader_code_compilation((GLuint)shader_code_cstr,shader_code_cstr._4_4_);
  return (GLuint)shader_code_cstr;
}

Assistant:

GLuint compile_shader(
    const std::string &p_content,
    const ShaderType p_type) noexcept
{
    GLuint shader_id = DEFAULT_SHADER_ID;

    switch (p_type)
    {
    case ShaderType::VERTEX:
    {
        shader_id = glCreateShader(GL_VERTEX_SHADER);
        break;
    };
    case ShaderType::FRAGMENT:
    {
        shader_id = glCreateShader(GL_FRAGMENT_SHADER);
        break;
    };
    case ShaderType::GEOMETRY:
    {
        shader_id = glCreateShader(GL_GEOMETRY_SHADER);
        break;
    }
    default:
    {
        std::cerr << "unable to compile shader"
                  << "\n";
        return shader_id;
    };
    };

    const char *shader_code_cstr = p_content.c_str();
    glShaderSource(shader_id, 1, &shader_code_cstr, nullptr);
    glCompileShader(shader_id);
    test_shader_code_compilation(shader_id, p_type);
    return shader_id;
}